

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

String * __thiscall
Jinx::Impl::Parser::ParseVariable_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  pointer pSVar1;
  bool bVar2;
  size_t sVar3;
  Symbol *pSVar4;
  ulong uVar5;
  char *format;
  ulong uVar6;
  Symbol *pSVar7;
  
  if ((this->m_error == false) &&
     (pSVar1 = (this->m_currentSymbol)._M_current,
     pSVar1 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    if (pSVar1->type == NameValue) {
      sVar3 = VariableStackFrame::GetMaxVariableParts(&this->m_variableStackFrame);
      while (sVar3 != 0) {
        pSVar4 = (this->m_currentSymbol)._M_current;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        basic_string(__return_storage_ptr__,&pSVar4->text);
        uVar5 = 1;
        uVar6 = uVar5;
        for (; pSVar7 = pSVar4 + 1, uVar5 < sVar3; uVar5 = uVar5 + 1) {
          if ((((this->m_error == false) &&
               (pSVar7 != (this->m_symbolList->
                          super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                          )._M_impl.super__Vector_impl_data._M_finish)) && (pSVar7->type != NewLine)
              ) && (pSVar4[1].text._M_string_length != 0)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                      (__return_storage_ptr__," ");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                      (__return_storage_ptr__,&pSVar4[1].text);
            uVar6 = uVar6 + 1;
          }
          pSVar4 = pSVar7;
        }
        bVar2 = VariableStackFrame::VariableExists
                          (&this->m_variableStackFrame,__return_storage_ptr__);
        if (bVar2) {
          pSVar4 = (this->m_currentSymbol)._M_current;
          while( true ) {
            bVar2 = uVar6 == 0;
            uVar6 = uVar6 - 1;
            if (bVar2) break;
            this->m_lastLine = pSVar4->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar4 + 1;
            pSVar4 = pSVar4 + 1;
          }
          return __return_storage_ptr__;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(__return_storage_ptr__);
        sVar3 = sVar3 - 1;
      }
      format = "Could not parse variable name";
    }
    else {
      format = "Unexpected symbol type when parsing variable";
    }
    Error<>(this,format);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseVariable()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing variable");
			return String();
		}

		// Check up to the max number of parts until we find a variable match
		auto maxParts = m_variableStackFrame.GetMaxVariableParts();
		for (size_t s = maxParts; s > 0; --s)
		{
			auto curr = m_currentSymbol;
			auto name = String(curr->text);
			size_t symbolCount = 1;
			for (size_t i = 1; i < s; ++i)
			{
				++curr;
				if (!IsSymbolValid(curr) || curr->text.empty())
					continue;
				name += " ";
				name += curr->text;
				++symbolCount;
			}
			bool exists = VariableExists(name);
			if (exists)
			{
				// Now that we know the longest variable count that matches, advance this number of symbols
				for (size_t i = 0; i < symbolCount; ++i)
					NextSymbol();

				// Return the variable name
				return name;
			}
		}
		Error("Could not parse variable name");
		return String();
	}